

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O2

bool __thiscall BanMan::IsBanned(BanMan *this,CNetAddr *net_addr)

{
  long lVar1;
  bool bVar2;
  int64_t iVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock6;
  CSubNet sub_net;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = GetTime();
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock6,&this->m_banned_mutex,"m_banned_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/banman.cpp"
             ,0x5c,false);
  p_Var4 = (this->m_banned)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(this->m_banned)._M_t._M_impl.super__Rb_tree_header;
  do {
    if ((_Rb_tree_header *)p_Var4 == p_Var5) {
LAB_006b9b8d:
      std::unique_lock<std::mutex>::~unique_lock(&criticalblock6.super_unique_lock);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return (_Rb_tree_header *)p_Var4 != p_Var5;
      }
      __stack_chk_fail();
    }
    CSubNet::CSubNet(&sub_net,(CSubNet *)(p_Var4 + 1));
    if (iVar3 < (long)p_Var4[3]._M_parent) {
      bVar2 = CSubNet::Match(&sub_net,net_addr);
      if (bVar2) {
        prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&sub_net);
        goto LAB_006b9b8d;
      }
    }
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&sub_net);
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

bool BanMan::IsBanned(const CNetAddr& net_addr)
{
    auto current_time = GetTime();
    LOCK(m_banned_mutex);
    for (const auto& it : m_banned) {
        CSubNet sub_net = it.first;
        CBanEntry ban_entry = it.second;

        if (current_time < ban_entry.nBanUntil && sub_net.Match(net_addr)) {
            return true;
        }
    }
    return false;
}